

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O0

unique_pointer<const_unsigned_char> __thiscall
pstore::unique_pointer_cast<unsigned_char_const,void_const>
          (pstore *this,unique_pointer<const_void> *p)

{
  pointer __p;
  deleter_type *pp_Var1;
  _Head_base<0UL,_const_unsigned_char_*,_false> extraout_RDX;
  unique_pointer<const_unsigned_char> uVar2;
  _func_void_uchar_ptr *local_20;
  unique_ptr<const_void,_void_(*)(const_void_*)> *local_18;
  unique_pointer<const_void> *p_local;
  
  local_18 = p;
  p_local = (unique_pointer<const_void> *)this;
  __p = (pointer)std::unique_ptr<const_void,_void_(*)(const_void_*)>::release(p);
  pp_Var1 = std::unique_ptr<const_void,_void_(*)(const_void_*)>::get_deleter(local_18);
  local_20 = (_func_void_uchar_ptr *)*pp_Var1;
  std::unique_ptr<unsigned_char_const,void(*)(unsigned_char_const*)>::
  unique_ptr<void(*)(unsigned_char_const*),void>
            ((unique_ptr<unsigned_char_const,void(*)(unsigned_char_const*)> *)this,__p,&local_20);
  uVar2._M_t.super___uniq_ptr_impl<const_unsigned_char,_void_(*)(const_unsigned_char_*)>._M_t.
  super__Tuple_impl<0UL,_const_unsigned_char_*,_void_(*)(const_unsigned_char_*)>.
  super__Head_base<0UL,_const_unsigned_char_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
  uVar2._M_t.super___uniq_ptr_impl<const_unsigned_char,_void_(*)(const_unsigned_char_*)>._M_t.
  super__Tuple_impl<0UL,_const_unsigned_char_*,_void_(*)(const_unsigned_char_*)>.
  super__Tuple_impl<1UL,_void_(*)(const_unsigned_char_*)>.
  super__Head_base<1UL,_void_(*)(const_unsigned_char_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(const_unsigned_char_*),_false>)
       (_Head_base<1UL,_void_(*)(const_unsigned_char_*),_false>)this;
  return (unique_pointer<const_unsigned_char>)
         uVar2._M_t.super___uniq_ptr_impl<const_unsigned_char,_void_(*)(const_unsigned_char_*)>._M_t
         .super__Tuple_impl<0UL,_const_unsigned_char_*,_void_(*)(const_unsigned_char_*)>;
}

Assistant:

unique_pointer<To> unique_pointer_cast (unique_pointer<From> && p) {
        // Note that we know that the cast of the deleter function is safe. This function will
        // either be deleter_nop (in the vast majority of instances) or deleter<> whose
        // underlying memory is always allocated as uint8_t[] by get_spanningu().
        return unique_pointer<To const> (
            reinterpret_cast<To const *> (p.release ()),
            reinterpret_cast<unique_deleter<To const>> (p.get_deleter ()));
    }